

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  pointer pcVar1;
  long lVar2;
  FieldDescriptor *pFVar3;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
  _Var4;
  int iVar5;
  JavaType JVar6;
  OneofGeneratorInfo *args_1;
  _Rb_tree_node_base *p_Var7;
  LogMessage *pLVar8;
  long *plVar9;
  FieldDescriptor **ppFVar10;
  Descriptor *pDVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  uint32_t uVar15;
  long lVar16;
  uint32_t uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  java *this_00;
  bool bVar21;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields_for_is_initialized_check;
  string line;
  LogFinisher local_a9;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_a8;
  FieldDescriptor *local_88;
  iterator iStack_80;
  FieldDescriptor **local_78;
  Printer *local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  io::Printer::Indent(printer);
  local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar11 = (this->super_MessageGenerator).descriptor_;
  bVar21 = *(char *)(*(long *)(pDVar11 + 0x10) + 0x3a) == '\x02';
  uVar15 = bVar21 + 2;
  if (*(char *)(*(long *)(pDVar11 + 0x20) + 0x48) == '\0') {
    uVar15 = (uint32_t)bVar21;
  }
  WriteUInt32ToUtf16CharSequence(uVar15,&local_a8);
  WriteUInt32ToUtf16CharSequence
            (*(uint32_t *)((this->super_MessageGenerator).descriptor_ + 4),&local_a8);
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 4) == 0) {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = null;");
  }
  else {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = new java.lang.Object[] {\n");
    io::Printer::Indent(printer);
    WriteUInt32ToUtf16CharSequence
              ((uint32_t)
               (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count,&local_a8);
    local_70 = printer;
    for (p_Var7 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var7 !=
        &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      args_1 = Context::GetOneofGeneratorInfo(this->context_,*(OneofDescriptor **)(p_Var7 + 1));
      io::Printer::Print<char[11],std::__cxx11::string>
                (local_70,"\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n",(char (*) [11])0x3f146d,
                 &args_1->name);
    }
    pDVar11 = (this->super_MessageGenerator).descriptor_;
    if (*(int *)(pDVar11 + 4) < 1) {
      uVar15 = 0;
    }
    else {
      lVar20 = 0;
      lVar14 = 0;
      iVar18 = 0;
      do {
        lVar16 = *(long *)(pDVar11 + 0x28);
        if (*(Descriptor **)(lVar16 + 0x20 + lVar20) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x8a);
          pLVar8 = internal::LogMessage::operator<<
                             ((LogMessage *)local_68,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_68);
        }
        if ((*(byte *)(lVar16 + 1 + lVar20) & 8) == 0) {
          plVar9 = (long *)(*(long *)(lVar16 + 0x20 + lVar20) + 0x28);
        }
        else {
          lVar2 = *(long *)(lVar16 + 0x28 + lVar20);
          if (lVar2 == 0) {
            plVar9 = (long *)(*(long *)(lVar16 + 0x10 + lVar20) + 0x70);
          }
          else {
            plVar9 = (long *)(lVar2 + 0x50);
          }
        }
        iVar5 = (**(code **)(*(long *)(this->field_generators_).field_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(int)((ulong)((lVar16 - *plVar9) + lVar20) >> 3) * 0x38e38e39
                                      ]._M_t.
                                      super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                                      ._M_t + 0x10))();
        iVar18 = iVar18 + iVar5;
        lVar14 = lVar14 + 1;
        pDVar11 = (this->super_MessageGenerator).descriptor_;
        lVar20 = lVar20 + 0x48;
      } while (lVar14 < *(int *)(pDVar11 + 4));
      iVar5 = iVar18 + 0x3e;
      if (-1 < iVar18 + 0x1f) {
        iVar5 = iVar18 + 0x1f;
      }
      uVar15 = iVar5 >> 5;
      if (0 < iVar18) {
        uVar17 = 1;
        if (1 < (int)uVar15) {
          uVar17 = uVar15;
        }
        this_00 = (java *)0x0;
        uVar12 = extraout_RDX;
        do {
          GetBitFieldName_abi_cxx11_((string *)local_68,this_00,(int)uVar12);
          io::Printer::Print<char[15],std::__cxx11::string>
                    (local_70,"\"$bit_field_name$\",\n",(char (*) [15])"bit_field_name",
                     (string *)local_68);
          uVar12 = extraout_RDX_00;
          if ((FieldDescriptor *)local_68._0_8_ != (FieldDescriptor *)(local_68 + 0x10)) {
            operator_delete((void *)local_68._0_8_);
            uVar12 = extraout_RDX_01;
          }
          uVar19 = (int)this_00 + 1;
          this_00 = (java *)(ulong)uVar19;
        } while (uVar17 != uVar19);
      }
    }
    WriteUInt32ToUtf16CharSequence(uVar15,&local_a8);
    ppFVar10 = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    if (*(int *)((this->super_MessageGenerator).descriptor_ + 4) < 1) {
      uVar17 = 0;
      uVar15 = 0;
    }
    else {
      lVar14 = 0;
      uVar15 = 0;
      uVar17 = 0;
      do {
        pFVar3 = ppFVar10[lVar14];
        if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
          local_68._0_8_ = FieldDescriptor::TypeOnceInit;
          local_88 = pFVar3;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar3 + 0x18),(_func_void_FieldDescriptor_ptr **)local_68,
                     &local_88);
        }
        if ((pFVar3[2] == (FieldDescriptor)0xb) &&
           (bVar21 = FieldDescriptor::is_map_message_type(pFVar3), bVar21)) {
          uVar17 = uVar17 + 1;
        }
        else {
          uVar15 = uVar15 + ((~(byte)pFVar3[1] & 0x60) == 0);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < *(int *)((this->super_MessageGenerator).descriptor_ + 4));
    }
    WriteUInt32ToUtf16CharSequence(*(uint32_t *)(*ppFVar10 + 4),&local_a8);
    WriteUInt32ToUtf16CharSequence
              (*(uint32_t *)
                (ppFVar10[(long)*(int *)((this->super_MessageGenerator).descriptor_ + 4) + -1] + 4),
               &local_a8);
    WriteUInt32ToUtf16CharSequence
              (*(uint32_t *)((this->super_MessageGenerator).descriptor_ + 4),&local_a8);
    WriteUInt32ToUtf16CharSequence(uVar17,&local_a8);
    WriteUInt32ToUtf16CharSequence(uVar15,&local_a8);
    printer = local_70;
    local_88 = (FieldDescriptor *)0x0;
    iStack_80._M_current = (FieldDescriptor **)0x0;
    local_78 = (FieldDescriptor **)0x0;
    pDVar11 = (this->super_MessageGenerator).descriptor_;
    if (*(int *)(pDVar11 + 4) < 1) {
      uVar15 = 0;
    }
    else {
      lVar14 = 0;
      lVar20 = 0;
      do {
        lVar16 = *(long *)(pDVar11 + 0x28);
        if ((*(byte *)(lVar16 + 1 + lVar14) & 0x60) == 0x40) {
LAB_002d1419:
          local_68._0_8_ = lVar16 + lVar14;
          if (iStack_80._M_current == local_78) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&local_88,iStack_80,(FieldDescriptor **)local_68);
          }
          else {
            *iStack_80._M_current = (FieldDescriptor *)local_68._0_8_;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
        }
        else {
          JVar6 = GetJavaType((FieldDescriptor *)(lVar16 + lVar14));
          if (JVar6 == JAVATYPE_MESSAGE) {
            pDVar11 = FieldDescriptor::message_type
                                ((FieldDescriptor *)
                                 (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) +
                                 lVar14));
            bVar21 = HasRequiredFields(pDVar11);
            if (bVar21) {
              lVar16 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
              goto LAB_002d1419;
            }
          }
        }
        lVar20 = lVar20 + 1;
        pDVar11 = (this->super_MessageGenerator).descriptor_;
        lVar14 = lVar14 + 0x48;
      } while (lVar20 < *(int *)(pDVar11 + 4));
      uVar15 = (uint32_t)((ulong)((long)iStack_80._M_current - (long)local_88) >> 3);
    }
    WriteUInt32ToUtf16CharSequence(uVar15,&local_a8);
    if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 4)) {
      lVar14 = 0;
      do {
        pFVar3 = ppFVar10[lVar14];
        if (*(Descriptor **)(pFVar3 + 0x20) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x8a);
          pLVar8 = internal::LogMessage::operator<<
                             ((LogMessage *)local_68,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=(&local_a9,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_68);
        }
        if (((byte)pFVar3[1] & 8) == 0) {
          plVar9 = (long *)(*(long *)(pFVar3 + 0x20) + 0x28);
        }
        else if (*(long *)(pFVar3 + 0x28) == 0) {
          plVar9 = (long *)(*(long *)(pFVar3 + 0x10) + 0x70);
        }
        else {
          plVar9 = (long *)(*(long *)(pFVar3 + 0x28) + 0x50);
        }
        _Var4._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
        .
        super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
        ._M_head_impl =
             (this->field_generators_).field_generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(int)((ulong)((long)pFVar3 - *plVar9) >> 3) * 0x38e38e39]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
             ._M_t;
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                              ._M_head_impl + 0x38))
                  (_Var4._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                   ._M_head_impl,printer,&local_a8);
        lVar14 = lVar14 + 1;
      } while (lVar14 < *(int *)((this->super_MessageGenerator).descriptor_ + 4));
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"};\n");
    if (local_88 != (FieldDescriptor *)0x0) {
      operator_delete(local_88);
    }
    operator_delete__(ppFVar10);
  }
  io::Printer::Print<>(printer,"java.lang.String info =\n");
  pcVar1 = local_68 + 0x10;
  local_68._8_8_ = (char *)0x0;
  local_58[0]._M_local_buf[0] = '\0';
  local_68._0_8_ = pcVar1;
  if (local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      EscapeUtf16ToString(local_a8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar13],(string *)local_68);
      if ((char *)0x4f < (ulong)local_68._8_8_) {
        io::Printer::Print<char[7],std::__cxx11::string>
                  (printer,"    \"$string$\" +\n",(char (*) [7])0x4349c5,(string *)local_68);
        local_68._8_8_ = (char *)0x0;
        *(char *)local_68._0_8_ = '\0';
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)local_a8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1));
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            (printer,"    \"$string$\";\n",(char (*) [7])0x4349c5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  io::Printer::Print<>(printer,"return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  io::Printer::Outdent(printer);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  if (local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16_t> chars;

  int flags = 0;
  if (IsProto2(descriptor_->file())) {
    flags |= 0x1;
  }
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(oneofs_.size(), &chars);
    for (auto oneof : oneofs_) {
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16_t code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}